

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.h
# Opt level: O0

BasicHeapType __thiscall wasm::HeapType::getBottom(HeapType *this)

{
  BasicHeapType BVar1;
  Shareability share;
  HeapType local_18;
  HeapType *local_10;
  HeapType *this_local;
  
  local_10 = this;
  BVar1 = wasm::HeapType::getUnsharedBottom();
  HeapType(&local_18,BVar1);
  share = wasm::HeapType::getShared();
  BVar1 = getBasic(&local_18,share);
  return BVar1;
}

Assistant:

BasicHeapType getBottom() const {
    return HeapType(getUnsharedBottom()).getBasic(getShared());
  }